

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

optional<CTxOut> * __thiscall
wallet::CCoinControl::GetExternalOutput(CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  optional<CTxOut> *in_RSI;
  PreselectedInput *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  PreselectedInput *__t;
  undefined6 in_stack_ffffffffffffffa0;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffa7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __t = in_RDI;
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::find((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          *)in_RDI,(key_type *)in_RDI);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::end((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
         *)__t);
  bVar2 = std::operator==((_Self *)in_RSI,(_Self *)__t);
  bVar3 = 1;
  if (!bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_> *)
               in_RDI);
    bVar2 = PreselectedInput::HasTxOut(in_RDI);
    bVar3 = bVar2 ^ 0xff;
  }
  if ((bVar3 & 1) == 0) {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_wallet::PreselectedInput>_> *)
               in_RDI);
    PreselectedInput::GetTxOut
              ((PreselectedInput *)
               CONCAT17(in_stack_ffffffffffffffa7,CONCAT16(bVar3,in_stack_ffffffffffffffa0)));
    std::optional<CTxOut>::optional<CTxOut,_true>(in_RSI,(CTxOut *)__t);
    CTxOut::~CTxOut((CTxOut *)in_RDI);
  }
  else {
    std::optional<CTxOut>::optional(&in_RDI->m_txout);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &__t->m_txout;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CTxOut> CCoinControl::GetExternalOutput(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    if (it == m_selected.end() || !it->second.HasTxOut()) {
        return std::nullopt;
    }
    return it->second.GetTxOut();
}